

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall
Catch::clara::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
          *columns)

{
  pointer *ppiVar1;
  Column *pCVar2;
  iterator __position;
  Column *col;
  Column *pCVar3;
  iterator local_60;
  
  this->m_columns = columns;
  (this->m_iterators).
  super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_activeIterators = 0;
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,
            ((long)(columns->
                   super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(columns->
                   super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pCVar3 = (this->m_columns->
           super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar2) {
    do {
      local_60.m_stringIndex =
           (long)(pCVar3->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pCVar3->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      local_60.m_end._0_1_ = 0;
      local_60.m_end._1_7_ = 0;
      local_60.m_suffix = false;
      local_60.m_pos = 0;
      local_60.m_len._0_1_ = 0;
      local_60.m_len._1_7_ = 0;
      __position._M_current =
           (this->m_iterators).
           super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_iterators).
          super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_60.m_column = pCVar3;
        std::
        vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
        ::_M_realloc_insert<Catch::clara::TextFlow::Column::iterator>
                  (&this->m_iterators,__position,&local_60);
      }
      else {
        (__position._M_current)->m_end = 0;
        *(ulong *)&(__position._M_current)->m_suffix = (ulong)(uint7)local_60._41_7_ << 8;
        (__position._M_current)->m_pos = 0;
        (__position._M_current)->m_len = 0;
        (__position._M_current)->m_column = pCVar3;
        (__position._M_current)->m_stringIndex = local_60.m_stringIndex;
        ppiVar1 = &(this->m_iterators).
                   super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar1 = *ppiVar1 + 1;
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar2);
  }
  return;
}

Assistant:

iterator(Columns const& columns, EndTag)
			: m_columns(columns.m_columns),
			m_activeIterators(0) {
			m_iterators.reserve(m_columns.size());

			for (auto const& col : m_columns)
				m_iterators.push_back(col.end());
		}